

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.c
# Opt level: O1

void logfopen(LogContext *ctx)

{
  byte bVar1;
  _Bool _Var2;
  uint uVar3;
  Filename *pFVar4;
  byte *__s;
  strbuf *buf_o;
  byte *pbVar5;
  __int32_t **pp_Var6;
  size_t sVar7;
  char *__format;
  byte *pbVar8;
  wchar_t mode;
  byte *pbVar9;
  int iVar10;
  byte bVar11;
  tm tm;
  byte local_88;
  byte local_87;
  tm local_68;
  
  if (ctx->state != L_CLOSED) {
    return;
  }
  if (ctx->logtype != 0) {
    ltime();
    if (ctx->currlogfilename != (Filename *)0x0) {
      filename_free(ctx->currlogfilename);
    }
    pFVar4 = conf_get_filename(ctx->conf,0x81);
    __s = (byte *)conf_get_str(ctx->conf,0);
    uVar3 = conf_get_int(ctx->conf,1);
    buf_o = strbuf_new();
    pbVar5 = (byte *)filename_to_str(pFVar4);
    bVar11 = *pbVar5;
    if (bVar11 != 0) {
      do {
        pbVar9 = pbVar5 + 1;
        pbVar8 = &local_88;
        if (bVar11 == 0x26) {
          bVar1 = *pbVar9;
          if ((ulong)bVar1 == 0) {
            iVar10 = 0;
          }
          else {
            pbVar9 = pbVar5 + 2;
            pp_Var6 = __ctype_tolower_loc();
            iVar10 = (*pp_Var6)[bVar1];
            if (iVar10 < 0x70) {
              if (iVar10 == 100) {
                __format = "%d";
LAB_00105a73:
                sVar7 = strftime((char *)&local_88,0x20,__format,&local_68);
                iVar10 = (int)sVar7;
              }
              else if (iVar10 == 0x68) {
                sVar7 = strlen((char *)__s);
                iVar10 = (int)sVar7;
                pbVar8 = __s;
              }
              else {
                if (iVar10 == 0x6d) {
                  __format = "%m";
                  goto LAB_00105a73;
                }
LAB_00105a34:
                local_88 = 0x26;
                iVar10 = 1;
                if (bVar1 != 0x26) {
                  local_87 = bVar1;
                  iVar10 = 2;
                }
              }
            }
            else {
              if (iVar10 != 0x70) {
                if (iVar10 == 0x74) {
                  __format = "%H%M%S";
                }
                else {
                  if (iVar10 != 0x79) goto LAB_00105a34;
                  __format = "%Y";
                }
                goto LAB_00105a73;
              }
              iVar10 = sprintf((char *)&local_88,"%d",(ulong)uVar3);
            }
          }
        }
        else {
          local_88 = bVar11;
          iVar10 = 1;
        }
        if (0 < iVar10) {
          iVar10 = iVar10 + 1;
          do {
            bVar1 = *pbVar8;
            if (bVar11 == 0x26) {
              bVar1 = filename_char_sanitise(bVar1);
            }
            pbVar8 = pbVar8 + 1;
            BinarySink_put_byte(buf_o->binarysink_,bVar1);
            iVar10 = iVar10 + -1;
          } while (1 < iVar10);
        }
        bVar11 = *pbVar9;
        pbVar5 = pbVar9;
      } while (bVar11 != 0);
    }
    pFVar4 = filename_from_str(buf_o->s);
    strbuf_free(buf_o);
    ctx->currlogfilename = pFVar4;
    _Var2 = open_for_write_would_lose_data(pFVar4);
    mode = L'\x02';
    if (_Var2) {
      iVar10 = conf_get_int(ctx->conf,0x83);
      if (iVar10 == -1) {
        mode = (*ctx->lp->vt->askappend)(ctx->lp,ctx->currlogfilename,logfopen_callback,ctx);
      }
      else {
        mode = (uint)(iVar10 == 1) + L'\x01';
      }
    }
    if (mode < L'\0') {
      ctx->state = L_OPENING;
    }
    else {
      logfopen_callback(ctx,mode);
    }
  }
  return;
}

Assistant:

void logfopen(LogContext *ctx)
{
    struct tm tm;
    int mode;

    /* Prevent repeat calls */
    if (ctx->state != L_CLOSED)
        return;

    if (!ctx->logtype)
        return;

    tm = ltime();

    /* substitute special codes in file name */
    if (ctx->currlogfilename)
        filename_free(ctx->currlogfilename);
    ctx->currlogfilename =
        xlatlognam(conf_get_filename(ctx->conf, CONF_logfilename),
                   conf_get_str(ctx->conf, CONF_host),
                   conf_get_int(ctx->conf, CONF_port), &tm);

    if (open_for_write_would_lose_data(ctx->currlogfilename)) {
        int logxfovr = conf_get_int(ctx->conf, CONF_logxfovr);
        if (logxfovr != LGXF_ASK) {
            mode = ((logxfovr == LGXF_OVR) ? 2 : 1);
        } else
            mode = lp_askappend(ctx->lp, ctx->currlogfilename,
                                logfopen_callback, ctx);
    } else
        mode = 2;                      /* create == overwrite */

    if (mode < 0)
        ctx->state = L_OPENING;
    else
        logfopen_callback(ctx, mode);  /* open the file */
}